

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexParser.cpp
# Opt level: O3

int __thiscall
UnifiedRegex::Parser<NullTerminatedUnicodeEncodingPolicy,_true>::TryParseExtendedUnicodeEscape
          (Parser<NullTerminatedUnicodeEncodingPolicy,_true> *this,Char *c,
          bool *previousSurrogatePart,bool trackSurrogatePair)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  Char CVar4;
  EncodedChar EVar5;
  undefined4 *puVar6;
  ulong uVar7;
  EncodedChar *pEVar8;
  undefined7 in_register_00000009;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  EncodedChar *pEVar12;
  uint codePoint;
  char16 local_36;
  undefined4 local_34;
  char16 other;
  
  local_34 = (undefined4)CONCAT71(in_register_00000009,trackSurrogatePair);
  if (((this->scriptContext->config).threadConfig)->m_ES6Unicode != true) {
    return 0;
  }
  pEVar12 = this->next;
  if (this->inputLim < pEVar12 + 2) {
    return 0;
  }
  if (this->inputLim < pEVar12) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00eb1a81;
    *puVar6 = 0;
    pEVar12 = this->next;
  }
  if (*pEVar12 != L'{') {
    return 0;
  }
  if (this->inputLim < pEVar12 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00eb1a81;
    *puVar6 = 0;
    pEVar12 = this->next;
  }
  uVar7 = (ulong)(ushort)pEVar12[1];
  if (0xff < uVar7) {
    return 0;
  }
  if ((ASCIIChars::classes[uVar7] & 0x40) == 0) {
    return 0;
  }
  if (this->inputLim < pEVar12 + 1) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00eb1a81;
    *puVar6 = 0;
    pEVar12 = this->next;
    uVar7 = (ulong)(ushort)pEVar12[1];
    codePoint = 0;
    if ((ushort)pEVar12[1] < 0x100) goto LAB_00eb1718;
  }
  else {
LAB_00eb1718:
    codePoint = (uint)(byte)ASCIIChars::values[uVar7];
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  uVar7 = 2;
  while( true ) {
    iVar2 = (int)uVar7;
    uVar11 = (ulong)(iVar2 + 1);
    pEVar8 = this->inputLim;
    if (pEVar8 < pEVar12 + uVar11) break;
    if (pEVar8 < pEVar12 + uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00eb1a81;
      *puVar6 = 0;
      pEVar12 = this->next;
    }
    uVar9 = (ulong)(ushort)pEVar12[uVar7];
    if (0xff < uVar9) {
      pEVar8 = this->inputLim;
      break;
    }
    pEVar8 = this->inputLim;
    if ((ASCIIChars::classes[uVar9] & 0x40) == 0) break;
    if (pEVar8 < pEVar12 + uVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                         ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
      if (!bVar3) goto LAB_00eb1a81;
      *puVar6 = 0;
      pEVar12 = this->next;
      uVar9 = (ulong)(ushort)pEVar12[uVar7];
      uVar10 = 0;
      if ((ushort)pEVar12[uVar7] < 0x100) goto LAB_00eb1858;
    }
    else {
LAB_00eb1858:
      uVar10 = (uint)(byte)ASCIIChars::values[uVar9];
    }
    codePoint = codePoint * 0x10 + uVar10;
    uVar7 = uVar11;
    if (0x10ffff < codePoint) {
      DeferredFailIfUnicode(this,-0x7ff5e9d6);
      return 0;
    }
  }
  if (pEVar8 < pEVar12 + uVar11) {
    return 0;
  }
  if (pEVar8 < pEVar12 + uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0xc4,"(next + n <= inputLim)","next + n <= inputLim");
    if (!bVar3) goto LAB_00eb1a81;
    *puVar6 = 0;
    pEVar12 = this->next;
  }
  if (pEVar12[uVar7] != L'}') {
    return 0;
  }
  uVar10 = iVar2 + 1;
  if (uVar10 < 3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                       ,0x111,"(consumptionNumber >= 3)","consumptionNumber >= 3");
    if (!bVar3) goto LAB_00eb1a81;
    *puVar6 = 0;
  }
  if ((((char)local_34 != '\0') && (*previousSurrogatePart == false)) &&
     (((this->scriptContext->config).threadConfig)->m_ES6Unicode == true)) {
    TrackIfSurrogatePair(this,codePoint,this->next + -1,iVar2 + 2);
  }
  if (codePoint < 0x10000) {
    CVar4 = Chars<char16_t>::UTC(codePoint);
    *c = CVar4;
  }
  else {
    if (*previousSurrogatePart != true) {
      *previousSurrogatePart = true;
      Js::NumberUtilities::CodePointAsSurrogatePair(codePoint,c,&local_36);
      EVar5 = ECLookback(this,1);
      if ((EVar5 != L'u') || (EVar5 = ECLookback(this,2), EVar5 != L'\\')) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexParser.cpp"
                           ,300,"(ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\')",
                           "ECLookback(1) == \'u\' && ECLookback(2) == \'\\\\\'");
        if (!bVar3) {
LAB_00eb1a81:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar6 = 0;
      }
      ECRevert(this,2);
      return uVar10;
    }
    *previousSurrogatePart = false;
    Js::NumberUtilities::CodePointAsSurrogatePair(codePoint,&local_36,c);
  }
  ECConsumeMultiUnit(this,uVar10);
  return uVar10;
}

Assistant:

int Parser<P, IsLiteral>::TryParseExtendedUnicodeEscape(Char& c, bool& previousSurrogatePart, bool trackSurrogatePair /* = false */)
    {
        if (!scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            return 0;
        }

        if (!ECCanConsume(2) || ECLookahead(0) !='{' || !standardEncodedChars->IsHex(ECLookahead(1)))
        {
            return 0;
        }

        // The first character is mandatory to consume escape sequence, so we check for it above, at this stage we can set it as we already checked.
        codepoint_t codePoint = standardEncodedChars->DigitValue(ECLookahead(1));

        int i = 2;

        while(ECCanConsume(i + 1) && standardEncodedChars->IsHex(ECLookahead(i)))
        {
            codePoint <<= 4;
            codePoint += standardEncodedChars->DigitValue(ECLookahead(i));

            if (codePoint > 0x10FFFF)
            {
                DeferredFailIfUnicode(JSERR_RegExpInvalidEscape);
                return 0;
            }
            i++;
        }

        if(!ECCanConsume(i + 1) || ECLookahead(i) != '}')
        {
            return 0;
        }

        uint consumptionNumber = i + 1;
        Assert(consumptionNumber >= 3);

        if (!previousSurrogatePart && trackSurrogatePair && this->scriptContext->GetConfig()->IsES6UnicodeExtensionsEnabled())
        {
            // Current location
            TrackIfSurrogatePair(codePoint, (next - 1), consumptionNumber + 1);
        }

        char16 other;
        // Generally if this code point is a single character, then we take it and return.
        // If the character is made up of two characters then we emit the first and backtrack to the start of th escape sequence;
        // Following that we check if we have already seen the first character, and if so emit the second and consume the entire escape sequence.
        if (codePoint < 0x10000)
        {
            c = UTC(codePoint);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else if (previousSurrogatePart)
        {
            previousSurrogatePart = false;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &other, &c);
            ECConsumeMultiUnit(consumptionNumber);
        }
        else
        {
            previousSurrogatePart = true;
            Js::NumberUtilities::CodePointAsSurrogatePair(codePoint, &c, &other);
            Assert(ECLookback(1) == 'u' && ECLookback(2) == '\\');
            ECRevert(2);
        }

        return consumptionNumber;
    }